

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O0

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,SmallBuffer *sb)

{
  SmallBuffer *pSVar1;
  pointer pvVar2;
  long in_RSI;
  SmallBuffer *in_RDI;
  bad_alloc *anon_var_0;
  SmallBuffer *buf;
  SmallBuffer *in_stack_ffffffffffffffc8;
  
  if ((in_RDI->locked & 1U) != 0) {
    pSVar1 = operator=(in_stack_ffffffffffffffc8,in_RDI);
    return pSVar1;
  }
  if ((in_RDI->usingAllocatedBuffer & 1U) != 0) {
    if ((in_RDI->nonOwning & 1U) == 0) {
      if (*(byte **)(in_RSI + 0x50) == in_RDI->heap) {
        in_RDI->bufferSize = *(size_t *)(in_RSI + 0x40);
        return in_RDI;
      }
      if (in_RDI->heap != (byte *)0x0) {
        operator_delete__(in_RDI->heap);
      }
    }
    else if (*(byte **)(in_RSI + 0x50) == in_RDI->heap) {
      in_RDI->bufferSize = *(size_t *)(in_RSI + 0x40);
      in_RDI->bufferCapacity = *(size_t *)(in_RSI + 0x48);
      return in_RDI;
    }
  }
  if ((*(byte *)(in_RSI + 0x5a) & 1) == 0) {
    pvVar2 = std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x56a2fb);
    memcpy(pvVar2,*(void **)(in_RSI + 0x50),*(size_t *)(in_RSI + 0x40));
    in_RDI->usingAllocatedBuffer = false;
    in_RDI->nonOwning = false;
    pvVar2 = std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x56a327);
    in_RDI->heap = pvVar2;
    in_RDI->bufferCapacity = 0x40;
  }
  else {
    in_RDI->heap = *(byte **)(in_RSI + 0x50);
    in_RDI->bufferCapacity = *(size_t *)(in_RSI + 0x48);
    in_RDI->usingAllocatedBuffer = true;
    in_RDI->nonOwning = (bool)(*(byte *)(in_RSI + 0x58) & 1);
  }
  in_RDI->locked = (bool)(*(byte *)(in_RSI + 0x59) & 1);
  in_RDI->bufferSize = *(size_t *)(in_RSI + 0x40);
  pvVar2 = std::array<std::byte,_64UL>::data((array<std::byte,_64UL> *)0x56a365);
  *(pointer *)(in_RSI + 0x50) = pvVar2;
  *(undefined8 *)(in_RSI + 0x48) = 0x40;
  *(undefined8 *)(in_RSI + 0x40) = 0;
  *(undefined1 *)(in_RSI + 0x5a) = 0;
  *(undefined1 *)(in_RSI + 0x59) = 0;
  return in_RDI;
}

Assistant:

SmallBuffer& operator=(SmallBuffer&& sb) noexcept
    {
        if (locked) {
            // if locked then use the copy operation not move
            const SmallBuffer& buf = sb;
            try {
                return operator=(buf);
            }
            catch (std::bad_alloc&) {
                errorCondition = 2;
                return *this;
            }
        }
        if (usingAllocatedBuffer) {
            if (nonOwning) {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    bufferCapacity = sb.bufferCapacity;
                    return *this;
                }
            } else {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    return *this;
                }
                delete[] heap;
            }
        }

        if (sb.usingAllocatedBuffer) {
            heap = sb.heap;
            bufferCapacity = sb.bufferCapacity;
            usingAllocatedBuffer = true;
            nonOwning = sb.nonOwning;
        } else {
            std::memcpy(buffer.data(), sb.heap, sb.bufferSize);
            usingAllocatedBuffer = false;
            nonOwning = false;
            heap = buffer.data();
            bufferCapacity = 64;
        }
        locked = sb.locked;
        bufferSize = sb.bufferSize;
        sb.heap = sb.buffer.data();
        sb.bufferCapacity = 64;
        sb.bufferSize = 0;
        sb.usingAllocatedBuffer = false;
        sb.locked = false;

        return *this;
    }